

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

void handle_D_option(char *z)

{
  option_type oVar1;
  char *__s1;
  code *pcVar2;
  int iVar3;
  char **ppcVar4;
  size_t sVar5;
  char *pcVar6;
  ulong uVar7;
  FILE *__stream;
  int iVar8;
  s_options *psVar9;
  char *pcVar10;
  int n;
  char **ppcVar11;
  long lVar12;
  long lVar13;
  double dVar14;
  char *pcStack_78;
  char **ppcStack_70;
  double dStack_68;
  char **ppcStack_60;
  long lStack_58;
  
  lVar12 = (long)nDefine;
  nDefine = nDefine + 1;
  psVar9 = (s_options *)(lVar12 * 8 + 8);
  ppcVar4 = (char **)realloc(azDefine,(size_t)psVar9);
  if (ppcVar4 == (char **)0x0) {
    ppcVar11 = azDefine;
    azDefine = ppcVar4;
    handle_D_option_cold_2();
  }
  else {
    azDefine = ppcVar4;
    sVar5 = strlen(z);
    ppcVar11 = (char **)(long)((int)sVar5 + 1);
    pcVar6 = (char *)malloc((size_t)ppcVar11);
    ppcVar4[lVar12] = pcVar6;
    if (pcVar6 != (char *)0x0) {
      strcpy(pcVar6,z);
      for (; (*pcVar6 != '\0' && (*pcVar6 != '=')); pcVar6 = pcVar6 + 1) {
      }
      *pcVar6 = '\0';
      return;
    }
  }
  handle_D_option_cold_1();
  sVar5 = strlen((char *)ppcVar11);
  ppcVar4 = (char **)(long)((int)sVar5 + 1);
  user_templatename = (char *)malloc((size_t)ppcVar4);
  if (user_templatename != (char *)0x0) {
    strcpy(user_templatename,(char *)ppcVar11);
    return;
  }
  handle_T_option_cold_1();
  argv = ppcVar4;
  op = psVar9;
  errstream = (FILE *)__stream;
  if ((((ppcVar4 != (char **)0x0) && (psVar9 != (s_options *)0x0)) && (*ppcVar4 != (char *)0x0)) &&
     (pcVar6 = ppcVar4[1], pcVar6 != (char *)0x0)) {
    lVar13 = 1;
    iVar8 = 0;
    ppcStack_70 = ppcVar4;
    ppcStack_60 = ppcVar11;
    lStack_58 = lVar12;
    do {
      psVar9 = op;
      ppcVar4 = argv;
      n = (int)lVar13;
      if ((*pcVar6 == '-') || (*pcVar6 == '+')) {
        pcVar6 = op->label;
        if (pcVar6 == (char *)0x0) {
          lVar12 = 0;
        }
        else {
          pcVar10 = argv[lVar13];
          ppcVar11 = &op[1].label;
          lVar12 = 0;
          do {
            sVar5 = strlen(pcVar6);
            iVar3 = strncmp(pcVar10 + 1,pcVar6,(long)(int)sVar5);
            if (iVar3 == 0) break;
            lVar12 = lVar12 + 1;
            pcVar6 = *ppcVar11;
            ppcVar11 = ppcVar11 + 4;
          } while (pcVar6 != (char *)0x0);
        }
        if (psVar9[lVar12].label == (char *)0x0) {
          if (__stream == (FILE *)0x0) {
LAB_00105fc6:
            iVar3 = 1;
          }
          else {
            pcVar6 = "%sundefined option.\n";
LAB_00105fa1:
            fprintf(__stream,pcVar6,emsg);
            iVar3 = 1;
            errline(n,1,(FILE *)__stream);
          }
        }
        else {
          psVar9 = psVar9 + lVar12;
          pcVar2 = (code *)psVar9->arg;
          iVar3 = 0;
          if (pcVar2 != (code *)0x0) {
            oVar1 = psVar9->type;
            if (oVar1 == OPT_FSTR) {
              (*pcVar2)(ppcVar4[lVar13] + 2);
            }
            else if (oVar1 == OPT_FFLAG) {
              (*pcVar2)();
            }
            else {
              if (oVar1 != OPT_FLAG) {
                if (__stream == (FILE *)0x0) goto LAB_00105fc6;
                pcVar6 = "%smissing argument on switch.\n";
                goto LAB_00105fa1;
              }
              *(uint *)pcVar2 = (uint)(*ppcVar4[lVar13] == '-');
            }
          }
        }
        iVar8 = iVar8 + iVar3;
      }
      else {
        pcVar6 = strchr(pcVar6,0x3d);
        if (pcVar6 != (char *)0x0) {
          pcVar6 = strchr(ppcVar4[lVar13],0x3d);
          if (pcVar6 == (char *)0x0) {
            __assert_fail("cp!=0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/tools/lemon/lemon.c"
                          ,0x78a,"int handleswitch(int, FILE *)");
          }
          *pcVar6 = '\0';
          psVar9 = op;
          pcVar10 = op->label;
          if (pcVar10 == (char *)0x0) {
            lVar12 = 0;
          }
          else {
            __s1 = ppcVar4[lVar13];
            ppcVar4 = &op[1].label;
            lVar12 = 0;
            do {
              iVar3 = strcmp(__s1,pcVar10);
              if (iVar3 == 0) break;
              lVar12 = lVar12 + 1;
              pcVar10 = *ppcVar4;
              ppcVar4 = ppcVar4 + 4;
            } while (pcVar10 != (char *)0x0);
          }
          *pcVar6 = '=';
          if (psVar9[lVar12].label == (char *)0x0) {
            iVar3 = 1;
            if (__stream != (FILE *)0x0) {
              fprintf(__stream,"%sundefined option.\n",emsg);
              errline(n,0,(FILE *)__stream);
            }
          }
          else {
            oVar1 = psVar9[lVar12].type;
            dVar14 = 0.0;
            if (oVar1 - OPT_FLAG < 8) {
              pcVar6 = pcVar6 + 1;
              switch(oVar1) {
              default:
                if (__stream != (FILE *)0x0) {
                  fprintf(__stream,"%soption requires an argument.\n",emsg);
                  errline(n,0,(FILE *)__stream);
                  dVar14 = 0.0;
                }
                break;
              case OPT_INT:
              case OPT_FINT:
                iVar3 = 0;
                uVar7 = strtol(pcVar6,&pcStack_78,0);
                pcVar6 = pcStack_78;
                if ((*pcStack_78 != '\0') && (iVar3 = 1, __stream != (FILE *)0x0)) {
                  fprintf(__stream,"%sillegal character in integer argument.\n",emsg);
                  errline(n,(int)pcVar6 - *(int *)(argv + lVar13),(FILE *)__stream);
                }
                pcVar6 = (char *)0x0;
                dVar14 = 0.0;
                goto LAB_001060ab;
              case OPT_DBL:
              case OPT_FDBL:
                dVar14 = strtod(pcVar6,&pcStack_78);
                pcVar6 = pcStack_78;
                if (*pcStack_78 == '\0') goto LAB_001060a6;
                if (__stream != (FILE *)0x0) {
                  dStack_68 = dVar14;
                  fprintf(__stream,"%sillegal character in floating-point argument.\n",emsg);
                  errline(n,(int)pcVar6 - *(int *)(argv + lVar13),(FILE *)__stream);
                  dVar14 = dStack_68;
                }
                break;
              case OPT_STR:
              case OPT_FSTR:
                goto switchD_00105f02_caseD_4;
              }
              uVar7 = 0;
              iVar3 = 1;
              pcVar6 = (char *)0x0;
            }
            else {
LAB_001060a6:
              pcVar6 = (char *)0x0;
switchD_00105f02_caseD_4:
              uVar7 = 0;
              iVar3 = 0;
            }
LAB_001060ab:
            switch(op[lVar12].type) {
            case OPT_INT:
              *(int *)op[lVar12].arg = (int)uVar7;
              break;
            case OPT_DBL:
              *(double *)op[lVar12].arg = dVar14;
              break;
            case OPT_STR:
              *(char **)op[lVar12].arg = pcVar6;
              break;
            case OPT_FINT:
              (*(code *)op[lVar12].arg)(uVar7 & 0xffffffff);
              break;
            case OPT_FDBL:
              (*(code *)op[lVar12].arg)();
              break;
            case OPT_FSTR:
              (*(code *)op[lVar12].arg)(pcVar6);
            }
          }
          iVar8 = iVar3 + iVar8;
        }
      }
      pcVar6 = argv[lVar13 + 1];
      lVar13 = lVar13 + 1;
    } while (pcVar6 != (char *)0x0);
    if (0 < iVar8) {
      fprintf(__stream,"Valid command line options for \"%s\" are:\n",*ppcStack_70);
      OptPrint();
      exit(1);
    }
  }
  return;
}

Assistant:

static void handle_D_option(char *z){
  char **paz;
  nDefine++;
  azDefine = (char **) realloc(azDefine, sizeof(azDefine[0])*nDefine);
  if( azDefine==0 ){
    fprintf(stderr,"out of memory\n");
    exit(1);
  }
  paz = &azDefine[nDefine-1];
  *paz = (char *) malloc( lemonStrlen(z)+1 );
  if( *paz==0 ){
    fprintf(stderr,"out of memory\n");
    exit(1);
  }
  strcpy(*paz, z);
  for(z=*paz; *z && *z!='='; z++){}
  *z = 0;
}